

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O3

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar7;
  cmExportBuildFileGenerator *pcVar8;
  iterator iVar9;
  cmExportSet *pcVar10;
  long *plVar11;
  _Rb_tree_header *p_Var12;
  _Alloc_hider _Var13;
  string *psVar14;
  cmCommandArgument *this_01;
  pointer pbVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fname;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_268 [40];
  string local_240;
  string local_220;
  undefined1 local_200 [16];
  string local_1f0 [3];
  ios_base local_190 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15) < 0x21) {
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"called with too few arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_200);
    if ((string *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
    }
    return false;
  }
  iVar4 = std::__cxx11::string::compare((char *)pbVar15);
  if (iVar4 == 0) {
    bVar3 = HandlePackage(this,args);
    return bVar3;
  }
  iVar4 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  this_01 = &(this->ExportSetName).super_cmCommandArgument;
  if (iVar4 != 0) {
    this_01 = &(this->Targets).super_cmCommandArgument;
  }
  cmCommandArgument::Follows(this_01,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&this->ArgumentGroup,this_01);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&(this->super_cmCommand).Helper,args,&local_68);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Unknown arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_200);
    if ((string *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
    }
    bVar3 = false;
    goto LAB_002d88d8;
  }
  paVar1 = &local_220.field_2;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p = (pointer)paVar1;
  if ((this->Filename).super_cmCommandArgument.WasActive == false) {
    iVar4 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      pcVar2 = (this->ExportSetName).String._M_dataplus._M_p;
      local_200._0_8_ = local_1f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_200,pcVar2,pcVar2 + (this->ExportSetName).String._M_string_length);
      std::__cxx11::string::append(local_200);
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_200);
      if ((string *)local_200._0_8_ != local_1f0) {
        operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
      }
      goto LAB_002d837a;
    }
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"FILE <filename> option missing.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_200);
    if ((string *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
    }
LAB_002d8303:
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string
              ((string *)local_268,(this->Filename).String._M_dataplus._M_p,(allocator *)&local_240)
    ;
    cmsys::SystemTools::GetFilenameLastExtension((string *)local_200,(string *)local_268);
    iVar4 = std::__cxx11::string::compare(local_200);
    if ((string *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
    }
    if ((string *)local_268._0_8_ != (string *)(local_268 + 0x10)) {
      operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
    }
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"FILE option given filename \"",0x1c);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_200,(this->Filename).String._M_dataplus._M_p,
                          (this->Filename).String._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\" which does not have an extension of \".cmake\".\n",0x30);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
      if ((string *)local_268._0_8_ != (string *)(local_268 + 0x10)) {
LAB_002d827e:
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
LAB_002d828b:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      std::ios_base::~ios_base(local_190);
      goto LAB_002d8303;
    }
    std::__cxx11::string::_M_assign((string *)&local_220);
LAB_002d837a:
    bVar3 = cmsys::SystemTools::FileIsFullPath(local_220._M_dataplus._M_p);
    if (bVar3) {
      bVar3 = cmMakefile::CanIWriteThisFile
                        ((this->super_cmCommand).Makefile,local_220._M_dataplus._M_p);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"FILE option given filename \"",0x1c);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_200,local_220._M_dataplus._M_p,
                            local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\" which is in the source tree.\n",0x1f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
        if ((string *)local_268._0_8_ != (string *)(local_268 + 0x10)) goto LAB_002d827e;
        goto LAB_002d828b;
      }
    }
    else {
      pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)local_200,pcVar6,(allocator *)local_268);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_200._0_8_,(pointer)(local_200._0_8_ + local_200._8_8_));
      std::__cxx11::string::append((char *)&local_240);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_240,(ulong)local_220._M_dataplus._M_p);
      psVar14 = (string *)(plVar11 + 2);
      if ((string *)*plVar11 == psVar14) {
        local_268._16_8_ = (psVar14->_M_dataplus)._M_p;
        local_268._24_8_ = plVar11[3];
        local_268._0_8_ = (string *)(local_268 + 0x10);
      }
      else {
        local_268._16_8_ = (psVar14->_M_dataplus)._M_p;
        local_268._0_8_ = (string *)*plVar11;
      }
      local_268._8_8_ = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_268);
      if ((string *)local_268._0_8_ != (string *)(local_268 + 0x10)) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((string *)local_200._0_8_ != local_1f0) {
        operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
      }
    }
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    iVar4 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      if ((this->Append).Enabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"EXPORT signature does not recognise the APPEND option.",
                   0x36);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
      }
      else {
        if ((this->ExportOld).Enabled != true) {
          local_268._0_8_ = local_268 + 0x10;
          pcVar2 = (this->ExportSetName).String._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,pcVar2,
                     pcVar2 + (this->ExportSetName).String._M_string_length);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                          *)&this_00->ExportSets,(key_type *)local_268);
          p_Var12 = &(this_00->ExportSets).
                     super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                     ._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar9._M_node == p_Var12) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"Export set \"",0xc);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_200,(char *)local_268._0_8_,local_268._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" not found.",0xc);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_240);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
            std::ios_base::~ios_base(local_190);
          }
          else {
            pcVar10 = cmExportSetMap::operator[](&this_00->ExportSets,(string *)local_268);
            this->ExportSet = pcVar10;
          }
          if ((string *)local_268._0_8_ != (string *)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
          }
          if ((_Rb_tree_header *)iVar9._M_node != p_Var12) goto LAB_002d8a08;
          goto LAB_002d88b2;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,
                   "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                   ,0x4f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
      }
LAB_002d8879:
      if ((string *)local_268._0_8_ != (string *)(local_268 + 0x10)) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      std::ios_base::~ios_base(local_190);
LAB_002d88b2:
      bVar3 = false;
    }
    else {
      if ((this->Targets).super_cmCommandArgument.WasActive != true) {
        local_200._0_8_ = local_1f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,"EXPORT or TARGETS specifier missing.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_200);
        _Var13._M_p = local_1f0[0]._M_dataplus._M_p;
        psVar14 = (string *)local_200._0_8_;
        if ((string *)local_200._0_8_ != local_1f0) {
LAB_002d86a7:
          operator_delete(psVar14,(ulong)(_Var13._M_p + 1));
        }
        goto LAB_002d88b2;
      }
      pbVar15 = (this->Targets).Vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar15 !=
          (this->Targets).Vector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          bVar3 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar15);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"given ALIAS target \"",0x14);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_200,(pbVar15->_M_dataplus)._M_p,
                                pbVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
            goto LAB_002d8879;
          }
          pcVar7 = cmGlobalGenerator::FindTarget(this_00,pbVar15,false);
          if (pcVar7 == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"given target \"",0xe);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_200,(pbVar15->_M_dataplus)._M_p,
                                pbVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" which is not built by this project.",0x25);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
            goto LAB_002d8879;
          }
          if (pcVar7->TargetTypeValue == UTILITY) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_268,"given custom target \"",pbVar15);
            plVar11 = (long *)std::__cxx11::string::append(local_268);
            psVar14 = (string *)(plVar11 + 2);
            if ((string *)*plVar11 == psVar14) {
              local_1f0[0]._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
              local_1f0[0]._M_string_length = plVar11[3];
              local_200._0_8_ = local_1f0;
            }
            else {
              local_1f0[0]._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
              local_200._0_8_ = (string *)*plVar11;
            }
            local_200._8_8_ = plVar11[1];
            *plVar11 = (long)psVar14;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            cmCommand::SetError(&this->super_cmCommand,(string *)local_200);
            if ((string *)local_200._0_8_ != local_1f0) {
              operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
            }
            _Var13._M_p = (pointer)local_268._16_8_;
            psVar14 = (string *)local_268._0_8_;
            if ((string *)local_268._0_8_ == (string *)(local_268 + 0x10)) goto LAB_002d88b2;
            goto LAB_002d86a7;
          }
          if (pcVar7->TargetTypeValue == OBJECT_LIBRARY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"given OBJECT library \"",0x16);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_200,(pbVar15->_M_dataplus)._M_p,
                                pbVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_268);
            goto LAB_002d8879;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_88,pbVar15);
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 !=
                 (this->Targets).Vector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (((this->Append).Enabled == true) &&
         (pcVar8 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&local_220),
         pcVar8 != (cmExportBuildFileGenerator *)0x0)) {
        bVar3 = true;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pcVar8->Targets,
                   (pcVar8->Targets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
LAB_002d8a08:
        pcVar8 = (cmExportBuildFileGenerator *)operator_new(0x140);
        cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar8);
        cmExportFileGenerator::SetExportFile
                  ((cmExportFileGenerator *)pcVar8,local_220._M_dataplus._M_p);
        std::__cxx11::string::string
                  ((string *)local_200,(this->Namespace).String._M_dataplus._M_p,
                   (allocator *)local_268);
        std::__cxx11::string::_M_assign((string *)&(pcVar8->super_cmExportFileGenerator).Namespace);
        if ((string *)local_200._0_8_ != local_1f0) {
          operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
        }
        (pcVar8->super_cmExportFileGenerator).AppendMode = (this->Append).Enabled;
        if (this->ExportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pcVar8->Targets,&local_88);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet(pcVar8,this->ExportSet);
        }
        cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,pcVar8);
        (pcVar8->super_cmExportFileGenerator).ExportOld = (this->ExportOld).Enabled;
        local_268._0_8_ = (string *)0x0;
        local_268._8_8_ = (string *)0x0;
        local_268._16_8_ = (pointer)0x0;
        cmMakefile::GetConfigurations
                  (&local_50,(this->super_cmCommand).Makefile,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_268,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_268._0_8_ == local_268._8_8_) {
          local_200._0_8_ = local_1f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200)
          ;
          if ((string *)local_200._0_8_ != local_1f0) {
            operator_delete((void *)local_200._0_8_,(ulong)(local_1f0[0]._M_dataplus._M_p + 1));
          }
        }
        psVar14 = (string *)local_268._0_8_;
        if (local_268._0_8_ != local_268._8_8_) {
          do {
            cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)pcVar8,psVar14);
            psVar14 = psVar14 + 1;
          } while (psVar14 != (string *)local_268._8_8_);
        }
        if (this->ExportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,pcVar8);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268);
        bVar3 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar1) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
LAB_002d88d8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar3;
}

Assistant:

bool cmExportCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with too few arguments");
    return false;
    }

  if(args[0] == "PACKAGE")
    {
    return this->HandlePackage(args);
    }
  else if (args[0] == "EXPORT")
    {
    this->ExportSetName.Follows(0);
    this->ArgumentGroup.Follows(&this->ExportSetName);
    }
  else
    {
    this->Targets.Follows(0);
    this->ArgumentGroup.Follows(&this->Targets);
    }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    this->SetError("Unknown arguments.");
    return false;
    }

  std::string fname;
  if(!this->Filename.WasFound())
    {
    if (args[0] != "EXPORT")
      {
      this->SetError("FILE <filename> option missing.");
      return false;
      }
    fname = this->ExportSetName.GetString() + ".cmake";
    }
  else
    {
    // Make sure the file has a .cmake extension.
    if(cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString())
      != ".cmake")
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
      }
    fname = this->Filename.GetString();
    }

  // Get the file to write.
  if(cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    if(!this->Makefile->CanIWriteThisFile(fname.c_str()))
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
      }
    }
  else
    {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
    }

  std::vector<std::string> targets;

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();

  if(args[0] == "EXPORT")
    {
    if (this->Append.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
      }

    if (this->ExportOld.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
        "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
      }

    cmExportSetMap &setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end())
      {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
      }
    this->ExportSet = setMap[setName];
    }
  else if (this->Targets.WasFound())
    {
    for(std::vector<std::string>::const_iterator
        currentTarget = this->Targets.GetVector().begin();
        currentTarget != this->Targets.GetVector().end();
        ++currentTarget)
      {
      if (this->Makefile->IsAlias(*currentTarget))
        {
        std::ostringstream e;
        e << "given ALIAS target \"" << *currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
        }

      if(cmTarget* target = gg->FindTarget(*currentTarget))
        {
        if(target->GetType() == cmState::OBJECT_LIBRARY)
          {
          std::ostringstream e;
          e << "given OBJECT library \"" << *currentTarget
            << "\" which may not be exported.";
          this->SetError(e.str());
          return false;
          }
        if (target->GetType() == cmState::UTILITY)
          {
          this->SetError("given custom target \"" + *currentTarget
                         + "\" which may not be exported.");
          return false;
          }
        }
      else
        {
        std::ostringstream e;
        e << "given target \"" << *currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
        }
      targets.push_back(*currentTarget);
      }
    if (this->Append.IsEnabled())
      {
      if (cmExportBuildFileGenerator *ebfg = gg->GetExportedTargetsFile(fname))
        {
        ebfg->AppendTargets(targets);
        return true;
        }
      }
    }
  else
    {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
    }

  // Setup export file generation.
  cmExportBuildFileGenerator *ebfg = new cmExportBuildFileGenerator;
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet)
    {
    ebfg->SetExportSet(this->ExportSet);
    }
  else
    {
    ebfg->SetTargets(targets);
    }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if(configurationTypes.empty())
    {
    configurationTypes.push_back("");
    }
  for(std::vector<std::string>::const_iterator
        ci = configurationTypes.begin();
      ci != configurationTypes.end(); ++ci)
    {
    ebfg->AddConfiguration(*ci);
    }
  if (this->ExportSet)
    {
    gg->AddBuildExportExportSet(ebfg);
    }
  else
    {
    gg->AddBuildExportSet(ebfg);
    }

  return true;
}